

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

void cleanup_obj_make(void)

{
  wchar_t local_c;
  wchar_t i;
  
  for (local_c = L'\0'; local_c < num_money_types; local_c = local_c + L'\x01') {
    string_free(money_type[local_c].name);
  }
  mem_free(money_type);
  mem_free(alloc_ego_table);
  mem_free(obj_total_tval_great);
  mem_free(obj_total_tval);
  mem_free(obj_alloc_great);
  mem_free(obj_alloc);
  return;
}

Assistant:

static void cleanup_obj_make(void) {
	int i;
	for (i = 0; i < num_money_types; i++) {
		string_free(money_type[i].name);
	}
	mem_free(money_type);
	mem_free(alloc_ego_table);
	mem_free_alt(obj_total_tval_great);
	mem_free_alt(obj_total_tval);
	mem_free_alt(obj_alloc_great);
	mem_free_alt(obj_alloc);
}